

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall perfetto::protos::gen::TraceConfig::Serialize(TraceConfig *this,Message *msg)

{
  bool bVar1;
  reference this_00;
  reference this_01;
  TraceConfig_BuiltinDataSource *this_02;
  reference this_03;
  TraceConfig_StatsdMetadata *this_04;
  TraceConfig_GuardrailOverrides *this_05;
  TraceConfig_TriggerConfig *this_06;
  reference str;
  TraceConfig_IncrementalStateConfig *this_07;
  TraceConfig_IncidentReportConfig *this_08;
  TraceConfig_TraceFilter *this_09;
  TraceConfig_AndroidReportConfig *this_10;
  TraceConfig_CmdTraceStartDelay *this_11;
  Message *pMVar2;
  void *data;
  size_t size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *it_3;
  const_iterator __end2_3;
  const_iterator __begin2_3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_3;
  TraceConfig_ProducerConfig *it_2;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  vector<perfetto::protos::gen::TraceConfig_ProducerConfig,_std::allocator<perfetto::protos::gen::TraceConfig_ProducerConfig>_>
  *__range2_2;
  TraceConfig_DataSource *it_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<perfetto::protos::gen::TraceConfig_DataSource,_std::allocator<perfetto::protos::gen::TraceConfig_DataSource>_>
  *__range2_1;
  TraceConfig_BufferConfig *it;
  const_iterator __end2;
  const_iterator __begin2;
  vector<perfetto::protos::gen::TraceConfig_BufferConfig,_std::allocator<perfetto::protos::gen::TraceConfig_BufferConfig>_>
  *__range2;
  Message *msg_local;
  TraceConfig *this_local;
  
  __end2 = std::
           vector<perfetto::protos::gen::TraceConfig_BufferConfig,_std::allocator<perfetto::protos::gen::TraceConfig_BufferConfig>_>
           ::begin(&this->buffers_);
  it = (TraceConfig_BufferConfig *)
       std::
       vector<perfetto::protos::gen::TraceConfig_BufferConfig,_std::allocator<perfetto::protos::gen::TraceConfig_BufferConfig>_>
       ::end(&this->buffers_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_perfetto::protos::gen::TraceConfig_BufferConfig_*,_std::vector<perfetto::protos::gen::TraceConfig_BufferConfig,_std::allocator<perfetto::protos::gen::TraceConfig_BufferConfig>_>_>
                                     *)&it), bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<const_perfetto::protos::gen::TraceConfig_BufferConfig_*,_std::vector<perfetto::protos::gen::TraceConfig_BufferConfig,_std::allocator<perfetto::protos::gen::TraceConfig_BufferConfig>_>_>
              ::operator*(&__end2);
    pMVar2 = protozero::Message::BeginNestedMessage<protozero::Message>(msg,1);
    TraceConfig_BufferConfig::Serialize(this_00,pMVar2);
    __gnu_cxx::
    __normal_iterator<const_perfetto::protos::gen::TraceConfig_BufferConfig_*,_std::vector<perfetto::protos::gen::TraceConfig_BufferConfig,_std::allocator<perfetto::protos::gen::TraceConfig_BufferConfig>_>_>
    ::operator++(&__end2);
  }
  __end2_1 = std::
             vector<perfetto::protos::gen::TraceConfig_DataSource,_std::allocator<perfetto::protos::gen::TraceConfig_DataSource>_>
             ::begin(&this->data_sources_);
  it_1 = (TraceConfig_DataSource *)
         std::
         vector<perfetto::protos::gen::TraceConfig_DataSource,_std::allocator<perfetto::protos::gen::TraceConfig_DataSource>_>
         ::end(&this->data_sources_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<const_perfetto::protos::gen::TraceConfig_DataSource_*,_std::vector<perfetto::protos::gen::TraceConfig_DataSource,_std::allocator<perfetto::protos::gen::TraceConfig_DataSource>_>_>
                             *)&it_1), bVar1) {
    this_01 = __gnu_cxx::
              __normal_iterator<const_perfetto::protos::gen::TraceConfig_DataSource_*,_std::vector<perfetto::protos::gen::TraceConfig_DataSource,_std::allocator<perfetto::protos::gen::TraceConfig_DataSource>_>_>
              ::operator*(&__end2_1);
    pMVar2 = protozero::Message::BeginNestedMessage<protozero::Message>(msg,2);
    TraceConfig_DataSource::Serialize(this_01,pMVar2);
    __gnu_cxx::
    __normal_iterator<const_perfetto::protos::gen::TraceConfig_DataSource_*,_std::vector<perfetto::protos::gen::TraceConfig_DataSource,_std::allocator<perfetto::protos::gen::TraceConfig_DataSource>_>_>
    ::operator++(&__end2_1);
  }
  bVar1 = std::bitset<36UL>::operator[](&this->_has_field_,0x14);
  if (bVar1) {
    this_02 = protozero::CopyablePtr<perfetto::protos::gen::TraceConfig_BuiltinDataSource>::
              operator*(&this->builtin_data_sources_);
    pMVar2 = protozero::Message::BeginNestedMessage<protozero::Message>(msg,0x14);
    TraceConfig_BuiltinDataSource::Serialize(this_02,pMVar2);
  }
  bVar1 = std::bitset<36UL>::operator[](&this->_has_field_,3);
  if (bVar1) {
    protozero::Message::AppendVarInt<unsigned_int>(msg,3,this->duration_ms_);
  }
  bVar1 = std::bitset<36UL>::operator[](&this->_has_field_,4);
  if (bVar1) {
    protozero::Message::AppendTinyVarInt(msg,4,(uint)(this->enable_extra_guardrails_ & 1));
  }
  bVar1 = std::bitset<36UL>::operator[](&this->_has_field_,5);
  if (bVar1) {
    protozero::Message::AppendVarInt<perfetto::protos::gen::TraceConfig_LockdownModeOperation>
              (msg,5,this->lockdown_mode_);
  }
  __end2_2 = std::
             vector<perfetto::protos::gen::TraceConfig_ProducerConfig,_std::allocator<perfetto::protos::gen::TraceConfig_ProducerConfig>_>
             ::begin(&this->producers_);
  it_2 = (TraceConfig_ProducerConfig *)
         std::
         vector<perfetto::protos::gen::TraceConfig_ProducerConfig,_std::allocator<perfetto::protos::gen::TraceConfig_ProducerConfig>_>
         ::end(&this->producers_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_2,
                            (__normal_iterator<const_perfetto::protos::gen::TraceConfig_ProducerConfig_*,_std::vector<perfetto::protos::gen::TraceConfig_ProducerConfig,_std::allocator<perfetto::protos::gen::TraceConfig_ProducerConfig>_>_>
                             *)&it_2), bVar1) {
    this_03 = __gnu_cxx::
              __normal_iterator<const_perfetto::protos::gen::TraceConfig_ProducerConfig_*,_std::vector<perfetto::protos::gen::TraceConfig_ProducerConfig,_std::allocator<perfetto::protos::gen::TraceConfig_ProducerConfig>_>_>
              ::operator*(&__end2_2);
    pMVar2 = protozero::Message::BeginNestedMessage<protozero::Message>(msg,6);
    TraceConfig_ProducerConfig::Serialize(this_03,pMVar2);
    __gnu_cxx::
    __normal_iterator<const_perfetto::protos::gen::TraceConfig_ProducerConfig_*,_std::vector<perfetto::protos::gen::TraceConfig_ProducerConfig,_std::allocator<perfetto::protos::gen::TraceConfig_ProducerConfig>_>_>
    ::operator++(&__end2_2);
  }
  bVar1 = std::bitset<36UL>::operator[](&this->_has_field_,7);
  if (bVar1) {
    this_04 = protozero::CopyablePtr<perfetto::protos::gen::TraceConfig_StatsdMetadata>::operator*
                        (&this->statsd_metadata_);
    pMVar2 = protozero::Message::BeginNestedMessage<protozero::Message>(msg,7);
    TraceConfig_StatsdMetadata::Serialize(this_04,pMVar2);
  }
  bVar1 = std::bitset<36UL>::operator[](&this->_has_field_,8);
  if (bVar1) {
    protozero::Message::AppendTinyVarInt(msg,8,(uint)(this->write_into_file_ & 1));
  }
  bVar1 = std::bitset<36UL>::operator[](&this->_has_field_,0x1d);
  if (bVar1) {
    protozero::Message::AppendString(msg,0x1d,&this->output_path_);
  }
  bVar1 = std::bitset<36UL>::operator[](&this->_has_field_,9);
  if (bVar1) {
    protozero::Message::AppendVarInt<unsigned_int>(msg,9,this->file_write_period_ms_);
  }
  bVar1 = std::bitset<36UL>::operator[](&this->_has_field_,10);
  if (bVar1) {
    protozero::Message::AppendVarInt<unsigned_long>(msg,10,this->max_file_size_bytes_);
  }
  bVar1 = std::bitset<36UL>::operator[](&this->_has_field_,0xb);
  if (bVar1) {
    this_05 = protozero::CopyablePtr<perfetto::protos::gen::TraceConfig_GuardrailOverrides>::
              operator*(&this->guardrail_overrides_);
    pMVar2 = protozero::Message::BeginNestedMessage<protozero::Message>(msg,0xb);
    TraceConfig_GuardrailOverrides::Serialize(this_05,pMVar2);
  }
  bVar1 = std::bitset<36UL>::operator[](&this->_has_field_,0xc);
  if (bVar1) {
    protozero::Message::AppendTinyVarInt(msg,0xc,(uint)(this->deferred_start_ & 1));
  }
  bVar1 = std::bitset<36UL>::operator[](&this->_has_field_,0xd);
  if (bVar1) {
    protozero::Message::AppendVarInt<unsigned_int>(msg,0xd,this->flush_period_ms_);
  }
  bVar1 = std::bitset<36UL>::operator[](&this->_has_field_,0xe);
  if (bVar1) {
    protozero::Message::AppendVarInt<unsigned_int>(msg,0xe,this->flush_timeout_ms_);
  }
  bVar1 = std::bitset<36UL>::operator[](&this->_has_field_,0x17);
  if (bVar1) {
    protozero::Message::AppendVarInt<unsigned_int>(msg,0x17,this->data_source_stop_timeout_ms_);
  }
  bVar1 = std::bitset<36UL>::operator[](&this->_has_field_,0x10);
  if (bVar1) {
    protozero::Message::AppendTinyVarInt(msg,0x10,(uint)(this->notify_traceur_ & 1));
  }
  bVar1 = std::bitset<36UL>::operator[](&this->_has_field_,0x1e);
  if (bVar1) {
    protozero::Message::AppendVarInt<int>(msg,0x1e,this->bugreport_score_);
  }
  bVar1 = std::bitset<36UL>::operator[](&this->_has_field_,0x11);
  if (bVar1) {
    this_06 = protozero::CopyablePtr<perfetto::protos::gen::TraceConfig_TriggerConfig>::operator*
                        (&this->trigger_config_);
    pMVar2 = protozero::Message::BeginNestedMessage<protozero::Message>(msg,0x11);
    TraceConfig_TriggerConfig::Serialize(this_06,pMVar2);
  }
  __end2_3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this->activate_triggers_);
  it_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->activate_triggers_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_3,
                            (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&it_3), bVar1) {
    str = __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator*(&__end2_3);
    protozero::Message::AppendString(msg,0x12,str);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2_3);
  }
  bVar1 = std::bitset<36UL>::operator[](&this->_has_field_,0x15);
  if (bVar1) {
    this_07 = protozero::CopyablePtr<perfetto::protos::gen::TraceConfig_IncrementalStateConfig>::
              operator*(&this->incremental_state_config_);
    pMVar2 = protozero::Message::BeginNestedMessage<protozero::Message>(msg,0x15);
    TraceConfig_IncrementalStateConfig::Serialize(this_07,pMVar2);
  }
  bVar1 = std::bitset<36UL>::operator[](&this->_has_field_,0x13);
  if (bVar1) {
    protozero::Message::AppendTinyVarInt(msg,0x13,(uint)(this->allow_user_build_tracing_ & 1));
  }
  bVar1 = std::bitset<36UL>::operator[](&this->_has_field_,0x16);
  if (bVar1) {
    protozero::Message::AppendString(msg,0x16,&this->unique_session_name_);
  }
  bVar1 = std::bitset<36UL>::operator[](&this->_has_field_,0x18);
  if (bVar1) {
    protozero::Message::AppendVarInt<perfetto::protos::gen::TraceConfig_CompressionType>
              (msg,0x18,this->compression_type_);
  }
  bVar1 = std::bitset<36UL>::operator[](&this->_has_field_,0x19);
  if (bVar1) {
    this_08 = protozero::CopyablePtr<perfetto::protos::gen::TraceConfig_IncidentReportConfig>::
              operator*(&this->incident_report_config_);
    pMVar2 = protozero::Message::BeginNestedMessage<protozero::Message>(msg,0x19);
    TraceConfig_IncidentReportConfig::Serialize(this_08,pMVar2);
  }
  bVar1 = std::bitset<36UL>::operator[](&this->_has_field_,0x1f);
  if (bVar1) {
    protozero::Message::AppendVarInt<perfetto::protos::gen::TraceConfig_StatsdLogging>
              (msg,0x1f,this->statsd_logging_);
  }
  bVar1 = std::bitset<36UL>::operator[](&this->_has_field_,0x1b);
  if (bVar1) {
    protozero::Message::AppendVarInt<long>(msg,0x1b,this->trace_uuid_msb_);
  }
  bVar1 = std::bitset<36UL>::operator[](&this->_has_field_,0x1c);
  if (bVar1) {
    protozero::Message::AppendVarInt<long>(msg,0x1c,this->trace_uuid_lsb_);
  }
  bVar1 = std::bitset<36UL>::operator[](&this->_has_field_,0x21);
  if (bVar1) {
    this_09 = protozero::CopyablePtr<perfetto::protos::gen::TraceConfig_TraceFilter>::operator*
                        (&this->trace_filter_);
    pMVar2 = protozero::Message::BeginNestedMessage<protozero::Message>(msg,0x21);
    TraceConfig_TraceFilter::Serialize(this_09,pMVar2);
  }
  bVar1 = std::bitset<36UL>::operator[](&this->_has_field_,0x22);
  if (bVar1) {
    this_10 = protozero::CopyablePtr<perfetto::protos::gen::TraceConfig_AndroidReportConfig>::
              operator*(&this->android_report_config_);
    pMVar2 = protozero::Message::BeginNestedMessage<protozero::Message>(msg,0x22);
    TraceConfig_AndroidReportConfig::Serialize(this_10,pMVar2);
  }
  bVar1 = std::bitset<36UL>::operator[](&this->_has_field_,0x23);
  if (bVar1) {
    this_11 = protozero::CopyablePtr<perfetto::protos::gen::TraceConfig_CmdTraceStartDelay>::
              operator*(&this->cmd_trace_start_delay_);
    pMVar2 = protozero::Message::BeginNestedMessage<protozero::Message>(msg,0x23);
    TraceConfig_CmdTraceStartDelay::Serialize(this_11,pMVar2);
  }
  data = (void *)::std::__cxx11::string::data();
  size = ::std::__cxx11::string::size();
  protozero::Message::AppendRawProtoBytes(msg,data,size);
  return;
}

Assistant:

void TraceConfig::Serialize(::protozero::Message* msg) const {
  // Field 1: buffers
  for (auto& it : buffers_) {
    it.Serialize(msg->BeginNestedMessage<::protozero::Message>(1));
  }

  // Field 2: data_sources
  for (auto& it : data_sources_) {
    it.Serialize(msg->BeginNestedMessage<::protozero::Message>(2));
  }

  // Field 20: builtin_data_sources
  if (_has_field_[20]) {
    (*builtin_data_sources_).Serialize(msg->BeginNestedMessage<::protozero::Message>(20));
  }

  // Field 3: duration_ms
  if (_has_field_[3]) {
    msg->AppendVarInt(3, duration_ms_);
  }

  // Field 4: enable_extra_guardrails
  if (_has_field_[4]) {
    msg->AppendTinyVarInt(4, enable_extra_guardrails_);
  }

  // Field 5: lockdown_mode
  if (_has_field_[5]) {
    msg->AppendVarInt(5, lockdown_mode_);
  }

  // Field 6: producers
  for (auto& it : producers_) {
    it.Serialize(msg->BeginNestedMessage<::protozero::Message>(6));
  }

  // Field 7: statsd_metadata
  if (_has_field_[7]) {
    (*statsd_metadata_).Serialize(msg->BeginNestedMessage<::protozero::Message>(7));
  }

  // Field 8: write_into_file
  if (_has_field_[8]) {
    msg->AppendTinyVarInt(8, write_into_file_);
  }

  // Field 29: output_path
  if (_has_field_[29]) {
    msg->AppendString(29, output_path_);
  }

  // Field 9: file_write_period_ms
  if (_has_field_[9]) {
    msg->AppendVarInt(9, file_write_period_ms_);
  }

  // Field 10: max_file_size_bytes
  if (_has_field_[10]) {
    msg->AppendVarInt(10, max_file_size_bytes_);
  }

  // Field 11: guardrail_overrides
  if (_has_field_[11]) {
    (*guardrail_overrides_).Serialize(msg->BeginNestedMessage<::protozero::Message>(11));
  }

  // Field 12: deferred_start
  if (_has_field_[12]) {
    msg->AppendTinyVarInt(12, deferred_start_);
  }

  // Field 13: flush_period_ms
  if (_has_field_[13]) {
    msg->AppendVarInt(13, flush_period_ms_);
  }

  // Field 14: flush_timeout_ms
  if (_has_field_[14]) {
    msg->AppendVarInt(14, flush_timeout_ms_);
  }

  // Field 23: data_source_stop_timeout_ms
  if (_has_field_[23]) {
    msg->AppendVarInt(23, data_source_stop_timeout_ms_);
  }

  // Field 16: notify_traceur
  if (_has_field_[16]) {
    msg->AppendTinyVarInt(16, notify_traceur_);
  }

  // Field 30: bugreport_score
  if (_has_field_[30]) {
    msg->AppendVarInt(30, bugreport_score_);
  }

  // Field 17: trigger_config
  if (_has_field_[17]) {
    (*trigger_config_).Serialize(msg->BeginNestedMessage<::protozero::Message>(17));
  }

  // Field 18: activate_triggers
  for (auto& it : activate_triggers_) {
    msg->AppendString(18, it);
  }

  // Field 21: incremental_state_config
  if (_has_field_[21]) {
    (*incremental_state_config_).Serialize(msg->BeginNestedMessage<::protozero::Message>(21));
  }

  // Field 19: allow_user_build_tracing
  if (_has_field_[19]) {
    msg->AppendTinyVarInt(19, allow_user_build_tracing_);
  }

  // Field 22: unique_session_name
  if (_has_field_[22]) {
    msg->AppendString(22, unique_session_name_);
  }

  // Field 24: compression_type
  if (_has_field_[24]) {
    msg->AppendVarInt(24, compression_type_);
  }

  // Field 25: incident_report_config
  if (_has_field_[25]) {
    (*incident_report_config_).Serialize(msg->BeginNestedMessage<::protozero::Message>(25));
  }

  // Field 31: statsd_logging
  if (_has_field_[31]) {
    msg->AppendVarInt(31, statsd_logging_);
  }

  // Field 27: trace_uuid_msb
  if (_has_field_[27]) {
    msg->AppendVarInt(27, trace_uuid_msb_);
  }

  // Field 28: trace_uuid_lsb
  if (_has_field_[28]) {
    msg->AppendVarInt(28, trace_uuid_lsb_);
  }

  // Field 33: trace_filter
  if (_has_field_[33]) {
    (*trace_filter_).Serialize(msg->BeginNestedMessage<::protozero::Message>(33));
  }

  // Field 34: android_report_config
  if (_has_field_[34]) {
    (*android_report_config_).Serialize(msg->BeginNestedMessage<::protozero::Message>(34));
  }

  // Field 35: cmd_trace_start_delay
  if (_has_field_[35]) {
    (*cmd_trace_start_delay_).Serialize(msg->BeginNestedMessage<::protozero::Message>(35));
  }

  msg->AppendRawProtoBytes(unknown_fields_.data(), unknown_fields_.size());
}